

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprListDelete(sqlite3 *db,ExprList *pList)

{
  int iVar1;
  ExprList_item *p;
  
  if (pList != (ExprList *)0x0) {
    p = pList->a;
    if (0 < pList->nExpr) {
      iVar1 = 0;
      do {
        sqlite3ExprDelete(db,p->pExpr);
        sqlite3DbFree(db,p->zName);
        sqlite3DbFree(db,p->zSpan);
        iVar1 = iVar1 + 1;
        p = p + 1;
      } while (iVar1 < pList->nExpr);
      p = pList->a;
    }
    sqlite3DbFree(db,p);
    sqlite3DbFree(db,pList);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListDelete(sqlite3 *db, ExprList *pList){
  int i;
  struct ExprList_item *pItem;
  if( pList==0 ) return;
  assert( pList->a!=0 || pList->nExpr==0 );
  for(pItem=pList->a, i=0; i<pList->nExpr; i++, pItem++){
    sqlite3ExprDelete(db, pItem->pExpr);
    sqlite3DbFree(db, pItem->zName);
    sqlite3DbFree(db, pItem->zSpan);
  }
  sqlite3DbFree(db, pList->a);
  sqlite3DbFree(db, pList);
}